

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
Shell::assertReturn(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertReturn *assn)

{
  char cVar1;
  long lVar2;
  HeapType HVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  string *this_00;
  ActionResult *pAVar7;
  Literal *pLVar8;
  NaNResult nan;
  undefined1 auStack_3d8 [16];
  stringstream err;
  ostream local_3c0 [376];
  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult> local_248;
  Literal local_228;
  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult> local_210;
  Literal local_1f0;
  Literal local_1d8;
  undefined1 local_1c0 [8];
  ActionResult result;
  Literal local_168;
  Literal local_150;
  ActionResult *local_138;
  type *values;
  ActionResult **local_128;
  anon_class_16_2_e5cbf392 atIndex;
  Result<wasm::Ok> check;
  char *local_b0;
  undefined1 local_a8 [8];
  Literal val;
  Result<wasm::Ok> check_1;
  long local_48;
  uint local_3c;
  _Variant_storage<false,wasm::Ok,wasm::Err> *local_38;
  
  local_38 = (_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(auStack_3d8 + 8));
  doAction((ActionResult *)local_1c0,this,&assn->action);
  local_138 = (ActionResult *)0x0;
  if (result.
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
    local_138 = (ActionResult *)local_1c0;
  }
  if (result.
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
    if ((long)(result.
               super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               .
               super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
               ._M_u._32_8_ -
              result.
              super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              .
              super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
              ._M_u._24_8_) / 0x18 + (long)local_1c0 ==
        *(long *)&assn->field_0x70 - *(long *)&assn->expected >> 5) {
      local_3c = 0;
      local_b0 = "unexpected number of lanes";
      pAVar7 = (ActionResult *)local_1c0;
LAB_0014bf2d:
      uVar6 = (ulong)local_3c;
      lVar2 = *(long *)((long)&(pAVar7->
                               super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               ).
                               super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               .
                               super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                               ._M_u + 0x20);
      if ((ulong)((*(long *)((long)&(pAVar7->
                                    super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    ).
                                    super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    .
                                    super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    .
                                    super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    .
                                    super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    .
                                    super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                                    ._M_u + 0x28) - lVar2) / 0x18 + (long)local_1c0) <= uVar6)
      goto LAB_0014c414;
      local_128 = &local_138;
      atIndex.values = (type **)&local_3c;
      pLVar8 = (Literal *)(lVar2 + -0x18 + uVar6 * 0x18);
      if (uVar6 == 0) {
        pLVar8 = (Literal *)
                 ((long)&(pAVar7->
                         super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         ).
                         super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         .
                         super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         .
                         super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         .
                         super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         .
                         super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                         ._M_u + 8);
      }
      wasm::Literal::Literal((Literal *)local_a8,pLVar8);
      uVar5 = 0x16d;
      if (*(long *)&assn->expected == 0) {
switchD_0014bfd2_default:
        local_b0 = "unexpected expectation";
LAB_0014c658:
        wasm::handle_unreachable
                  (local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                   ,uVar5);
      }
      pLVar8 = (Literal *)(*(long *)&assn->expected + (ulong)local_3c * 0x20);
      switch(pLVar8[1].field_0.v128[0]) {
      case '\0':
        cVar1 = wasm::Literal::operator!=((Literal *)local_a8,pLVar8);
        if (cVar1 == '\0') goto LAB_0014c229;
        poVar4 = std::operator<<(local_3c0,"expected ");
        wasm::Literal::Literal
                  ((Literal *)
                   ((long)&result.
                           super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                   + 0x38),pLVar8);
        poVar4 = (ostream *)wasm::operator<<(poVar4,_auStack_3d8);
        poVar4 = std::operator<<(poVar4,", got ");
        wasm::Literal::Literal(&local_168,(Literal *)local_a8);
        poVar4 = (ostream *)wasm::operator<<(poVar4,_auStack_3d8);
        assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&atIndex.i,
                   &local_128);
        std::operator<<(poVar4,(string *)&atIndex.i);
        std::__cxx11::string::~string((string *)&atIndex.i);
        wasm::Literal::~Literal(&local_168);
        wasm::Literal::~Literal
                  ((Literal *)
                   ((long)&result.
                           super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           .
                           super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                   + 0x38));
        std::__cxx11::stringbuf::str();
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>(local_38,&atIndex.i);
        break;
      case '\x01':
        if (((char *)0x6 < val.field_0.func.super_IString.str._M_str) &&
           (((ulong)val.field_0.func.super_IString.str._M_str & 1) == 0)) {
          HVar3 = wasm::Type::getHeapType((Type *)&val.field_0.func.super_IString.str._M_str);
          cVar1 = wasm::HeapType::isSubType(HVar3,(HeapType)(pLVar8->field_0).i64);
          if (cVar1 != '\0') goto LAB_0014c229;
        }
        poVar4 = std::operator<<(local_3c0,"expected ");
        poVar4 = (ostream *)wasm::operator<<(poVar4,(HeapType)(pLVar8->field_0).i64);
        poVar4 = std::operator<<(poVar4," reference, got ");
        wasm::Literal::Literal(&local_150,(Literal *)local_a8);
        poVar4 = (ostream *)wasm::operator<<(poVar4,_auStack_3d8);
        assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&atIndex.i,
                   &local_128);
        std::operator<<(poVar4,(string *)&atIndex.i);
        std::__cxx11::string::~string((string *)&atIndex.i);
        wasm::Literal::~Literal(&local_150);
        std::__cxx11::stringbuf::str();
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>(local_38,&atIndex.i);
        break;
      case '\x02':
        wasm::Literal::Literal(&local_228,(Literal *)local_a8);
        nan._4_4_ = 0;
        nan.kind = (pLVar8->field_0).i32;
        nan.type.id = (uintptr_t)(pLVar8->field_0).func.super_IString.str._M_str;
        checkNaN((Result<wasm::Ok> *)&atIndex.i,this,&local_228,nan);
        wasm::Literal::~Literal(&local_228);
        if (check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&atIndex.i);
          goto LAB_0014c229;
        }
        poVar4 = std::operator<<(local_3c0,(string *)&atIndex.i);
        assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val.type,
                   &local_128);
        std::operator<<(poVar4,(string *)&val.type);
        std::__cxx11::string::~string((string *)&val.type);
        std::__cxx11::stringbuf::str();
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>(local_38,&val.type);
        std::__cxx11::string::~string((string *)&val.type);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&atIndex.i);
        goto LAB_0014c639;
      case '\x03':
        lVar2 = (long)(pLVar8->field_0).gcData.
                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                - (pLVar8->field_0).i64 >> 5;
        values = (type *)pLVar8;
        if (lVar2 == 2) {
          pLVar8 = (Literal *)&atIndex.i;
          wasm::Literal::getLanesF64x2();
          local_48 = 0;
          for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
            wasm::Literal::Literal(&local_1d8,pLVar8);
            std::__detail::__variant::
            _Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>::_Copy_ctor_base
                      ((_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult> *)
                       &local_210,
                       (_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult> *)
                       ((values->super_SmallVector<wasm::Literal,_1UL>).usedFixed + local_48));
            checkLane((Result<wasm::Ok> *)&val.type,this,&local_1d8,(LaneResult *)&local_210,
                      (Index)lVar2);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::~_Variant_storage
                      (&local_210);
            wasm::Literal::~Literal(&local_1d8);
            if (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
              poVar4 = std::operator<<(local_3c0,(string *)&val.type);
              assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&local_128);
              std::operator<<(poVar4,(string *)
                                     ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::stringbuf::str();
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
              _Variant_storage<1ul,wasm::Err>
                        (local_38,(__index_type *)
                                  ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&val.type);
              std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&atIndex.i);
              goto LAB_0014c639;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&val.type);
            pLVar8 = pLVar8 + 1;
            local_48 = local_48 + 0x20;
          }
          std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&atIndex.i);
        }
        else {
          if (lVar2 != 4) {
            uVar5 = 0x16a;
            goto LAB_0014c658;
          }
          pLVar8 = (Literal *)&atIndex.i;
          wasm::Literal::getLanesF32x4();
          local_48 = 0;
          for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
            wasm::Literal::Literal(&local_1f0,pLVar8);
            std::__detail::__variant::
            _Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult>::_Copy_ctor_base
                      ((_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult> *)
                       &local_248,
                       (_Copy_ctor_base<false,_wasm::Literal,_wasm::WATParser::NaNResult> *)
                       ((values->super_SmallVector<wasm::Literal,_1UL>).usedFixed + local_48));
            checkLane((Result<wasm::Ok> *)&val.type,this,&local_1f0,(LaneResult *)&local_248,
                      (Index)lVar2);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::~_Variant_storage
                      (&local_248);
            wasm::Literal::~Literal(&local_1f0);
            if (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
              poVar4 = std::operator<<(local_3c0,(string *)&val.type);
              assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&local_128);
              std::operator<<(poVar4,(string *)
                                     ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::stringbuf::str();
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
              _Variant_storage<1ul,wasm::Err>
                        (local_38,(__index_type *)
                                  ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&val.type);
              std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&atIndex.i);
              goto LAB_0014c639;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&val.type);
            pLVar8 = pLVar8 + 1;
            local_48 = local_48 + 0x20;
          }
          std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&atIndex.i);
        }
LAB_0014c229:
        wasm::Literal::~Literal((Literal *)local_a8);
        local_3c = local_3c + 1;
        local_1c0 = *(undefined1 (*) [8])
                     &(local_138->
                      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      ).
                      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      .
                      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      .
                      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      .
                      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      .
                      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                      ._M_u;
        pAVar7 = local_138;
        goto LAB_0014bf2d;
      default:
        goto switchD_0014bfd2_default;
      }
      std::__cxx11::string::~string((string *)&atIndex.i);
LAB_0014c639:
      wasm::Literal::~Literal((Literal *)local_a8);
      goto LAB_0014c2ea;
    }
    poVar4 = std::operator<<(local_3c0,"expected ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," values, got ");
    resultToString_abi_cxx11_((string *)&atIndex.i,this,(ActionResult *)local_1c0);
    std::operator<<(poVar4,(string *)&atIndex.i);
    std::__cxx11::string::~string((string *)&atIndex.i);
    std::__cxx11::stringbuf::str();
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>(local_38,&atIndex.i);
    this_00 = (string *)&atIndex.i;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val.type,"expected return, got ",(allocator<char> *)local_a8);
    resultToString_abi_cxx11_
              ((string *)
               ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,
               (ActionResult *)local_1c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&atIndex.i,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val.type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>(local_38,&atIndex.i);
    std::__cxx11::string::~string((string *)&atIndex.i);
    std::__cxx11::string::~string
              ((string *)
               ((long)&check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    this_00 = (string *)&val.type;
  }
  std::__cxx11::string::~string(this_00);
LAB_0014c2ea:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_3d8 + 8));
  return (Result<wasm::Ok> *)local_38;
LAB_0014c414:
  local_38[0x20] = (_Variant_storage<false,wasm::Ok,wasm::Err>)0x0;
  goto LAB_0014c2ea;
}

Assistant:

Result<> assertReturn(AssertReturn& assn) {
    std::stringstream err;
    auto result = doAction(assn.action);
    auto* values = std::get_if<Literals>(&result);
    if (!values) {
      return Err{std::string("expected return, got ") + resultToString(result)};
    }
    if (values->size() != assn.expected.size()) {
      err << "expected " << assn.expected.size() << " values, got "
          << resultToString(result);
      return Err{err.str()};
    }
    for (Index i = 0; i < values->size(); ++i) {
      auto atIndex = [&]() {
        if (values->size() <= 1) {
          return std::string{};
        }
        std::stringstream ss;
        ss << " at index " << i;
        return ss.str();
      };

      Literal val = (*values)[i];
      auto& expected = assn.expected[i];
      if (auto* v = std::get_if<Literal>(&expected)) {
        if (val != *v) {
          err << "expected " << *v << ", got " << val << atIndex();
          return Err{err.str()};
        }
      } else if (auto* ref = std::get_if<RefResult>(&expected)) {
        if (!val.type.isRef() ||
            !HeapType::isSubType(val.type.getHeapType(), ref->type)) {
          err << "expected " << ref->type << " reference, got " << val
              << atIndex();
          return Err{err.str()};
        }
      } else if (auto* nan = std::get_if<NaNResult>(&expected)) {
        auto check = checkNaN(val, *nan);
        if (auto* e = check.getErr()) {
          err << e->msg << atIndex();
          return Err{err.str()};
        }
      } else if (auto* lanes = std::get_if<LaneResults>(&expected)) {
        switch (lanes->size()) {
          case 4: {
            auto vals = val.getLanesF32x4();
            for (Index i = 0; i < 4; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          case 2: {
            auto vals = val.getLanesF64x2();
            for (Index i = 0; i < 2; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          default:
            WASM_UNREACHABLE("unexpected number of lanes");
        }
      } else {
        WASM_UNREACHABLE("unexpected expectation");
      }
    }
    return Ok{};
  }